

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O1

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitSub(EExpr *__return_storage_ptr__,
          ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,BinaryExpr e)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ptr ppVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  EExpr er;
  BucketAccumulator<mp::EExpr> ba;
  EExpr local_7360;
  EExpr local_71a0;
  EExpr local_6fe0;
  BucketAccumulator<mp::EExpr> local_6e20;
  
  BucketAccumulator<mp::EExpr>::BucketAccumulator(&local_6e20,2);
  BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
  ::Visit(&local_6fe0,
          (BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
           *)this,(Expr)((ExprBase *)
                        ((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                               super_ExprBase.impl_ + 8))->impl_);
  BucketAccumulator<mp::EExpr>::Add(&local_6e20,&local_6fe0);
  if (6 < local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_6fe0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
  ::Visit(&local_71a0,
          (BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
           *)this,(Expr)((ExprBase *)
                        ((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                               super_ExprBase.impl_ + 0x10))->impl_);
  QuadAndLinTerms::negate((QuadAndLinTerms *)&local_71a0);
  dVar4 = local_71a0.super_QuadraticExpr.constant_term_;
  local_71a0.super_QuadraticExpr.constant_term_ = -local_71a0.super_QuadraticExpr.constant_term_;
  if (local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U> + 0x18);
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    if (local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      memcpy(local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
    }
  }
  else {
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
         local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U> + 0x18);
  }
  if (local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U> + 0x18);
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U> + 0x18);
  }
  ppVar3 = local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_data_ptr;
  if (local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_capacity < 9) {
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr
         = (ptr)((long)&local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_
                        .
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                + 0x18);
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_capacity
         = 8;
    if (local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
        != 0) {
      lVar5 = local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
              m_size << 4;
      lVar6 = 0;
      do {
        puVar1 = (undefined8 *)((long)&ppVar3->first + lVar6);
        uVar2 = puVar1[1];
        *(undefined8 *)
         ((long)&(local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                  .m_data.
                  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                 .m_data_ptr)->first + lVar6) = *puVar1;
        *(undefined8 *)
         ((long)&local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                 super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
         + lVar6 + 0x20) = uVar2;
        lVar6 = lVar6 + 0x10;
      } while (lVar5 != lVar6);
    }
  }
  else {
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr
         = local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_data_ptr;
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_capacity
         = local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_capacity;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_capacity
         = 8;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size = 0
    ;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr
         = (ptr)((long)&local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_
                        .
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                + 0x18);
  }
  if (local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                      coefs_aux_.super_small_vector_base<std::allocator<double>,_6U> + 0x18);
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    if (local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      memcpy(local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
    }
  }
  else {
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
         local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                      coefs_aux_.super_small_vector_base<std::allocator<double>,_6U> + 0x18);
  }
  if (local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                      vars1_aux_.super_small_vector_base<std::allocator<int>,_6U> + 0x18);
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                      vars1_aux_.super_small_vector_base<std::allocator<int>,_6U> + 0x18);
  }
  if (local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                      vars2_aux_.super_small_vector_base<std::allocator<int>,_6U> + 0x18);
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    if (local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
         local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.
                      vars2_aux_.super_small_vector_base<std::allocator<int>,_6U> + 0x18);
  }
  local_7360.super_QuadraticExpr.constant_term_ = -dVar4;
  BucketAccumulator<mp::EExpr>::Add(&local_6e20,&local_7360);
  if (6 < local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_7360.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  BucketAccumulator<mp::EExpr>::ExtractSum(__return_storage_ptr__,&local_6e20);
  if (6 < local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_71a0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  BucketAccum1Type<mp::QuadTerms>::~BucketAccum1Type(&local_6e20.ba_q_);
  BucketAccum1Type<mp::LinTerms>::~BucketAccum1Type(&local_6e20.ba_l_);
  return __return_storage_ptr__;
}

Assistant:

EExpr VisitSub(BinaryExpr e) {
    BucketAccumulator<EExpr> ba;
    ba.Add( Convert2EExpr(e.lhs()) );
    auto er = Convert2EExpr(e.rhs());
    er.negate();
    ba.Add( std::move(er) );
    return ba.ExtractSum();
  }